

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O3

int __thiscall
ncnn::Yolov3DetectionOutput::forward
          (Yolov3DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
  *this_00;
  undefined4 uVar1;
  size_t sVar2;
  iterator __position;
  Mat *this_01;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  void *pvVar5;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar6;
  int iVar7;
  Allocator *pAVar8;
  undefined4 *puVar9;
  int iVar10;
  ulong uVar11;
  BBoxRect *__args;
  float *pfVar12;
  ulong uVar13;
  long lVar14;
  pointer pMVar15;
  Yolov3DetectionOutput *this_02;
  long lVar16;
  float *pfVar17;
  pointer piVar18;
  uint _h;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar24 [12];
  float *pfVar22;
  float fVar23;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar29;
  undefined1 auVar28 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  undefined1 local_198 [8];
  BBoxRect *pBStack_190;
  BBoxRect *local_188;
  long local_180;
  BBoxRect local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  pointer local_128;
  Allocator *local_120;
  pointer local_118;
  float *local_110;
  float *local_108;
  Yolov3DetectionOutput *local_100;
  float local_f8;
  float fStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined1 local_e8 [16];
  pointer local_d8;
  pointer local_d0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_c8;
  pointer local_c0;
  void *local_b8;
  int *local_b0;
  void *local_a8;
  long local_a0;
  Allocator *local_98;
  void *local_90;
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_158._M_allocated_capacity = 0;
  local_158._8_8_ = (void *)0x0;
  local_148._M_p = (pointer)0x0;
  this_02 = this;
  local_d8 = (pointer)top_blobs;
  local_d0 = (pointer)opt;
  if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    piVar18 = (pointer)0x0;
    local_100 = this;
    local_c8 = bottom_blobs;
    do {
      pvVar6 = local_c8;
      local_198 = (undefined1  [8])0x0;
      pBStack_190 = (BBoxRect *)0x0;
      local_188 = (BBoxRect *)0x0;
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::resize((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                *)local_198,(long)this->num_box);
      pMVar15 = (pvVar6->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar10 = this->num_box;
      iVar7 = pMVar15[(long)piVar18].c / iVar10;
      if (iVar7 != this->num_class + 5) {
        std::
        vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   *)local_198);
        iVar10 = -1;
        goto LAB_002b7058;
      }
      local_128 = piVar18;
      if (0 < iVar10) {
        pMVar15 = pMVar15 + (long)piVar18;
        uVar21._0_4_ = pMVar15->w;
        uVar21._4_4_ = pMVar15->h;
        local_68._0_4_ = (float)(int)(undefined4)uVar21;
        local_68._4_4_ = (undefined4)(int)uVar21._4_4_;
        fVar23 = *(float *)((long)(this->anchors_scale).data + (long)piVar18 * 4);
        local_120 = (Allocator *)(ulong)(uint)uVar21._4_4_;
        local_118 = (pointer)(uVar21 & 0xffffffff);
        local_88._0_4_ = (undefined4)(int)(fVar23 * local_68._0_4_);
        local_88._4_4_ = (undefined4)(int)(fVar23 * (float)local_68._4_4_);
        local_88._8_4_ = (float)(int)(fVar23 * 0.0);
        local_88._12_4_ = (float)(int)(fVar23 * 0.0);
        local_b8 = (void *)(long)iVar7;
        register0x000012c8 = 0x3f0000003f000000;
        auVar25 = rcpps(local_88,_local_68);
        local_78 = auVar25._0_4_;
        fStack_74 = auVar25._4_4_;
        fStack_70 = auVar25._8_4_;
        fStack_6c = auVar25._12_4_;
        local_78 = (1.0 - local_68._0_4_ * local_78) * local_78 + local_78;
        fStack_74 = (1.0 - (float)local_68._4_4_ * fStack_74) * fStack_74 + fStack_74;
        fStack_70 = (1.0 - fStack_70 * 0.5) * fStack_70 + fStack_70;
        fStack_6c = (1.0 - fStack_6c * 0.5) * fStack_6c + fStack_6c;
        local_b0 = (int *)((long)iVar10 * (long)piVar18 * 4);
        local_180 = 0;
        local_c0 = pMVar15;
        do {
          lVar14 = (long)pMVar15->w;
          if (pMVar15->dims == 3) {
            lVar19 = pMVar15->h * lVar14;
          }
          else {
            lVar19 = pMVar15->h * lVar14 * (long)pMVar15->d;
          }
          if (0 < (int)local_120) {
            lVar16 = local_180 * (long)local_b8;
            local_a8 = pMVar15->data;
            uVar21 = pMVar15->elemsize;
            sVar2 = pMVar15->cstep;
            local_108 = (float *)(sVar2 * lVar16 * uVar21 + (long)local_a8);
            local_110 = (float *)((lVar16 + 1) * sVar2 * uVar21 + (long)local_a8);
            pfVar12 = (float *)((lVar16 + 2) * sVar2 * uVar21 + (long)local_a8);
            pfVar17 = (float *)((lVar16 + 3) * sVar2 * uVar21 + (long)local_a8);
            pfVar22 = (float *)((lVar16 + 4) * sVar2 * uVar21 + (long)local_a8);
            local_a8 = (void *)((lVar16 + 5) * sVar2 * uVar21 + (long)local_a8);
            uVar20 = lVar19 * uVar21 + 0xf & 0xfffffffffffffff0;
            local_a0 = lVar14 * uVar21;
            register0x00001248 =
                 *(undefined8 *)
                  ((long)(this->biases).data +
                  (long)((int)*(float *)((long)local_b0 +
                                        (long)(local_180 * 4 + (long)(this->mask).data)) * 2) * 4);
            local_58 = 0x3f8000003f800000;
            pAVar8 = (Allocator *)0x0;
            do {
              local_98 = pAVar8;
              if (0 < (int)local_118) {
                local_48 = (float)(int)pAVar8;
                local_90 = (void *)(local_a0 * (long)pAVar8 + (long)local_a8);
                fStack_40 = (float)local_88._0_4_;
                fStack_3c = (float)local_88._4_4_;
                piVar18 = (pointer)0x0;
                fStack_44 = local_48;
                do {
                  if ((long)this->num_class < 1) {
                    iVar10 = 0;
                    auVar24 = ZEXT812(0xff7fffff);
                  }
                  else {
                    uVar11 = 0;
                    uVar13 = 0;
                    auVar24 = ZEXT812(0xff7fffff);
                    do {
                      fVar23 = *(float *)((long)local_90 +
                                         (uVar20 - uVar20 % uVar21) * uVar11 + (long)piVar18 * 4);
                      fVar36 = auVar24._0_4_;
                      if (fVar36 < fVar23) {
                        uVar13 = uVar11 & 0xffffffff;
                      }
                      iVar10 = (int)uVar13;
                      if (fVar23 <= fVar36) {
                        fVar23 = fVar36;
                      }
                      auVar24._4_8_ = 0;
                      auVar24._0_4_ = fVar23;
                      uVar11 = uVar11 + 1;
                    } while ((long)this->num_class != uVar11);
                  }
                  local_e8._12_4_ = 0;
                  local_e8._0_12_ = auVar24;
                  local_138._M_allocated_capacity._0_4_ = expf(-*pfVar22);
                  fVar23 = expf(-local_e8._0_4_);
                  fVar23 = 1.0 / ((fVar23 + 1.0) * (float)local_138._M_allocated_capacity._0_4_ +
                                 1.0);
                  if (local_100->confidence_threshold <= fVar23) {
                    auVar32 = ZEXT416((uint)*local_110);
                    local_f8 = -*local_108;
                    fStack_f4 = -*local_110;
                    uStack_f0 = 0x80000000;
                    uStack_ec = 0x80000000;
                    local_e8._0_4_ = fVar23;
                    local_138._M_allocated_capacity._0_4_ = expf(local_f8);
                    local_138._M_allocated_capacity._4_4_ = extraout_XMM0_Db;
                    fVar23 = expf(fStack_f4);
                    local_138._M_allocated_capacity._0_4_ =
                         (float)local_138._M_allocated_capacity._0_4_ + 1.0;
                    local_138._8_4_ = (float)local_138._M_allocated_capacity._4_4_ + 0.0;
                    local_138._12_4_ = extraout_XMM0_Db_00 + 0.0;
                    local_138._M_allocated_capacity._4_4_ = fVar23 + 1.0;
                    local_f8 = expf(*pfVar12);
                    fVar23 = expf(*pfVar17);
                    local_178.score = (float)local_e8._0_4_;
                    auVar25._4_4_ = local_138._M_allocated_capacity._4_4_;
                    auVar25._0_4_ = local_138._M_allocated_capacity._0_4_;
                    auVar25._8_4_ = local_138._8_4_;
                    auVar25._12_4_ = local_138._12_4_;
                    auVar25 = rcpps(auVar32,auVar25);
                    auVar31._0_4_ = (float)local_58._0_4_ * auVar25._0_4_;
                    auVar31._4_4_ = (float)local_58._4_4_ * auVar25._4_4_;
                    auVar31._8_4_ = fStack_50 * auVar25._8_4_;
                    auVar31._12_4_ = fStack_4c * auVar25._12_4_;
                    fVar26 = ((float)local_58._4_4_ -
                             (float)local_138._M_allocated_capacity._4_4_ * auVar31._4_4_) *
                             auVar25._4_4_ + auVar31._4_4_;
                    auVar3._4_8_ = auVar25._8_8_;
                    auVar3._0_4_ = fStack_44;
                    auVar32._0_8_ = auVar3._0_8_ << 0x20;
                    auVar32._8_4_ = fStack_40;
                    auVar32._12_4_ = fStack_3c;
                    auVar28._4_12_ = auVar32._4_12_;
                    auVar28._0_4_ = (float)(int)piVar18;
                    auVar32 = rcpps(auVar31,auVar28);
                    fVar35 = fVar26 * auVar32._4_4_;
                    local_178.area = local_f8 * fStack_50 * auVar32._8_4_;
                    fVar36 = fVar23 * fStack_4c * auVar32._12_4_;
                    local_178.area =
                         (local_f8 * fStack_50 - fStack_40 * local_178.area) * auVar32._8_4_ +
                         local_178.area;
                    fVar36 = (fVar23 * fStack_4c - fStack_3c * fVar36) * auVar32._12_4_ + fVar36;
                    fVar23 = (((float)local_58._0_4_ -
                              (float)local_138._M_allocated_capacity._0_4_ * auVar31._0_4_) *
                              auVar25._0_4_ + auVar31._0_4_ + auVar28._0_4_) * local_78;
                    fVar27 = (fVar26 + fStack_44) * fStack_74;
                    fVar29 = local_178.area * fStack_60;
                    fVar30 = fVar36 * fStack_5c;
                    auVar33._4_4_ = fVar30;
                    auVar33._0_4_ = fVar29;
                    auVar33._8_4_ = fVar23;
                    auVar33._12_4_ = fVar27;
                    local_178.xmin = fVar23 - fVar29;
                    local_178.ymin = fVar27 - fVar30;
                    auVar4._4_8_ = auVar33._8_8_;
                    auVar4._0_4_ = fVar30 + ((fVar26 - fStack_44 * fVar35) * auVar32._4_4_ + fVar35)
                                            * (float)local_68._4_4_;
                    auVar34._0_8_ = auVar4._0_8_ << 0x20;
                    auVar34._8_4_ = fVar23 + fVar29;
                    auVar34._12_4_ = fVar27 + fVar30;
                    local_178.area = local_178.area * fVar36;
                    this_00 = (vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                               *)((long)local_198 + local_180 * 0x18);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_178.xmax = auVar34._8_4_;
                    local_178.ymax = auVar34._12_4_;
                    local_178.label = iVar10;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::
                      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                                (this_00,__position,&local_178);
                    }
                    else {
                      (__position._M_current)->xmax = (float)(int)auVar34._8_8_;
                      (__position._M_current)->ymax = (float)(int)((ulong)auVar34._8_8_ >> 0x20);
                      (__position._M_current)->area = local_178.area;
                      (__position._M_current)->label = iVar10;
                      (__position._M_current)->score = (float)local_e8._0_4_;
                      (__position._M_current)->xmin = local_178.xmin;
                      (__position._M_current)->ymin = local_178.ymin;
                      (__position._M_current)->xmax = auVar34._8_4_;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x1c;
                    }
                  }
                  local_108 = local_108 + 1;
                  local_110 = local_110 + 1;
                  pfVar12 = pfVar12 + 1;
                  pfVar17 = pfVar17 + 1;
                  pfVar22 = pfVar22 + 1;
                  piVar18 = (pointer)((long)piVar18 + 1);
                  this = local_100;
                } while (piVar18 != local_118);
              }
              pAVar8 = (Allocator *)((long)&local_98->_vptr_Allocator + 1);
            } while (pAVar8 != local_120);
            iVar10 = this->num_box;
            pMVar15 = local_c0;
          }
          local_180 = local_180 + 1;
        } while (local_180 < iVar10);
        if (0 < iVar10) {
          lVar14 = 8;
          lVar19 = 0;
          do {
            std::
            vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>>
                      ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                        *)&local_158,local_158._8_8_,*(undefined8 *)((long)local_198 + lVar14 + -8),
                       *(undefined8 *)
                        ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                   *)local_198)->_M_impl).super__Vector_impl_data._M_start + lVar14)
                      );
            lVar19 = lVar19 + 1;
            lVar14 = lVar14 + 0x18;
          } while (lVar19 < this->num_box);
        }
      }
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                 *)local_198);
      piVar18 = (pointer)((long)local_128 + 1);
    } while (piVar18 < (pointer)(((long)(local_c8->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_c8->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_start >> 3) *
                                -0x71c71c71c71c71c7));
    this_02 = (Yolov3DetectionOutput *)local_198;
    if (local_158._M_allocated_capacity != local_158._8_8_) {
      this_02 = this;
      qsort_descent_inplace
                (this,(vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                       *)&local_158,0,
                 (int)((ulong)(local_158._8_8_ - local_158._0_8_) >> 2) * -0x49249249 + -1);
    }
  }
  local_178.score = 0.0;
  local_178.xmin = 0.0;
  local_178.ymin = 0.0;
  local_178.xmax = 0.0;
  local_178.ymax = 0.0;
  local_178.area = 0.0;
  nms_sorted_bboxes(this_02,(vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                             *)&local_158,
                    (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_178,
                    this->nms_threshold);
  local_198 = (undefined1  [8])0x0;
  pBStack_190 = (BBoxRect *)0x0;
  local_188 = (BBoxRect *)0x0;
  lVar14 = CONCAT44(local_178.xmin,local_178.score);
  lVar19 = CONCAT44(local_178.xmax,local_178.ymin);
  if (lVar19 == lVar14) {
    iVar10 = 0;
  }
  else {
    uVar21 = 0;
    do {
      __args = (BBoxRect *)(*(long *)(lVar14 + uVar21 * 8) * 0x1c + local_158._M_allocated_capacity)
      ;
      if (pBStack_190 == local_188) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
        ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                  ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                    *)local_198,(iterator)pBStack_190,__args);
        lVar14 = CONCAT44(local_178.xmin,local_178.score);
        lVar19 = CONCAT44(local_178.xmax,local_178.ymin);
      }
      else {
        fVar26 = __args->score;
        fVar27 = __args->xmin;
        fVar29 = __args->ymin;
        fVar30 = __args->xmax;
        fVar23 = __args->ymax;
        fVar36 = __args->area;
        iVar10 = __args->label;
        pBStack_190->xmax = __args->xmax;
        pBStack_190->ymax = fVar23;
        pBStack_190->area = fVar36;
        pBStack_190->label = iVar10;
        pBStack_190->score = fVar26;
        pBStack_190->xmin = fVar27;
        pBStack_190->ymin = fVar29;
        pBStack_190->xmax = fVar30;
        pBStack_190 = pBStack_190 + 1;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < (ulong)(lVar19 - lVar14 >> 3));
    _h = (int)((long)pBStack_190 - (long)local_198 >> 2) * -0x49249249;
    iVar10 = 0;
    if (_h != 0) {
      this_01 = (((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_d8->data)->_M_impl).
                super__Vector_impl_data._M_start;
      Mat::create(this_01,6,_h,4,(Allocator *)local_d0->refcount);
      iVar10 = -100;
      if (((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) &&
         (iVar10 = 0, 0 < (int)_h)) {
        iVar7 = this_01->w;
        sVar2 = this_01->elemsize;
        puVar9 = (undefined4 *)((long)this_01->data + 0x14);
        iVar10 = 0;
        lVar14 = 0;
        do {
          uVar1 = *(undefined4 *)
                   ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              *)local_198)->_M_impl).super__Vector_impl_data._M_start + lVar14);
          puVar9[-5] = (float)(*(int *)((long)&(((pointer)((long)local_198 + 0x18))->
                                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                               )._M_impl.super__Vector_impl_data._M_start + lVar14)
                              + 1);
          puVar9[-4] = uVar1;
          puVar9[-3] = *(undefined4 *)
                        ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                   *)local_198)->_M_impl).super__Vector_impl_data._M_start +
                        lVar14 + 4);
          puVar9[-2] = *(undefined4 *)
                        ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                   *)local_198)->_M_impl).super__Vector_impl_data._M_finish + lVar14
                        );
          puVar9[-1] = *(undefined4 *)
                        ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                   *)local_198)->_M_impl).super__Vector_impl_data._M_finish +
                        lVar14 + 4);
          *puVar9 = *(undefined4 *)
                     ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                *)local_198)->_M_impl).super__Vector_impl_data._M_end_of_storage +
                     lVar14);
          lVar14 = lVar14 + 0x1c;
          puVar9 = (undefined4 *)((long)puVar9 + (long)iVar7 * sVar2);
        } while ((ulong)(_h & 0x7fffffff) * 0x1c != lVar14);
      }
    }
  }
  if (local_198 != (undefined1  [8])0x0) {
    operator_delete((void *)local_198,(long)local_188 - (long)local_198);
  }
  pvVar5 = (void *)CONCAT44(local_178.xmin,local_178.score);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,CONCAT44(local_178.area,local_178.ymax) - (long)pvVar5);
  }
LAB_002b7058:
  if ((void *)local_158._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_158._M_allocated_capacity,(long)local_148._M_p - local_158._0_8_);
  }
  return iVar10;
}

Assistant:

int Yolov3DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
        //printf("%d %d\n", net_w, net_h);

        //printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + exp(-box_score_ptr[0]) * (1.f + exp(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}